

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::ARITH_OP(SQVM *this,SQUnsignedInteger op,SQObjectPtr *trg,SQObjectPtr *o1,SQObjectPtr *o2)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  ulong uVar4;
  ulong uVar5;
  SQObjectValue SVar6;
  SQTable *pSVar7;
  bool bVar8;
  SQTable *pSVar9;
  SQObjectType SVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  char *s;
  SQFloat SVar14;
  double dVar15;
  SQFloat SVar16;
  float fVar17;
  
  SVar2 = (o1->super_SQObject)._type;
  SVar3 = (o2->super_SQObject)._type;
  SVar10 = SVar3 | SVar2;
  puVar11 = (uint *)(ulong)SVar10;
  if ((SVar10 == 0x5000006) || (SVar10 == OT_FLOAT)) {
    SVar6 = (o1->super_SQObject)._unVal;
    if (SVar2 == OT_INTEGER) {
      SVar14 = (SQFloat)SVar6.nInteger;
    }
    else {
      SVar14 = SVar6.fFloat;
    }
    SVar6 = (o2->super_SQObject)._unVal;
    if (SVar3 == OT_INTEGER) {
      SVar16 = (SQFloat)SVar6.nInteger;
    }
    else {
      SVar16 = SVar6.fFloat;
    }
    fVar17 = 15.0;
    switch(op) {
    case 0x25:
      dVar15 = fmod((double)SVar14,(double)SVar16);
      fVar17 = (float)dVar15;
      break;
    case 0x2a:
      fVar17 = SVar14 * SVar16;
      break;
    case 0x2b:
      fVar17 = SVar14 + SVar16;
      break;
    case 0x2d:
      fVar17 = SVar14 - SVar16;
      break;
    case 0x2f:
      fVar17 = SVar14 / SVar16;
    }
    if (((trg->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((trg->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((trg->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    (trg->super_SQObject)._type = OT_FLOAT;
    (trg->super_SQObject)._unVal.pTable = (SQTable *)0x0;
    (trg->super_SQObject)._unVal.fFloat = fVar17;
    return true;
  }
  if (SVar10 == OT_INTEGER) {
    uVar12 = op - 0x25;
    uVar13 = uVar12;
    pSVar9 = (SQTable *)0xdeadbeef;
    if (uVar12 < 0xb) {
      uVar4 = (o1->super_SQObject)._unVal.nInteger;
      uVar5 = (o2->super_SQObject)._unVal.nInteger;
      puVar11 = &switchD_001297d2::switchdataD_0013acb4;
      uVar13 = (long)&switchD_001297d2::switchdataD_0013acb4 +
               (long)(int)(&switchD_001297d2::switchdataD_0013acb4)[uVar12];
      switch(uVar12) {
      case 0:
        if (uVar5 == 0) {
          s = "modulo by zero";
          goto LAB_0012993c;
        }
        puVar11 = (uint *)~uVar5;
        uVar13 = uVar4 ^ 0xffffffff80000000 | (ulong)puVar11;
        if (uVar13 == 0) {
          pSVar9 = (SQTable *)0x0;
        }
        else {
          puVar11 = (uint *)((long)uVar4 % (long)uVar5);
          pSVar9 = (SQTable *)puVar11;
        }
        break;
      case 5:
        pSVar9 = (SQTable *)(uVar5 * uVar4);
        break;
      case 6:
        pSVar9 = (SQTable *)(uVar5 + uVar4);
        break;
      case 8:
        pSVar9 = (SQTable *)(uVar4 - uVar5);
        break;
      case 10:
        if (uVar5 == 0) {
          s = "division by zero";
        }
        else {
          uVar13 = uVar4 ^ 0xffffffff80000000 | ~uVar5;
          if (uVar13 != 0) {
            pSVar9 = (SQTable *)((long)uVar4 / (long)uVar5);
            puVar11 = (uint *)((long)uVar4 % (long)uVar5);
            break;
          }
          s = "integer overflow";
        }
LAB_0012993c:
        Raise_Error(this,s);
        return false;
      }
    }
    if (((trg->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((trg->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        pSVar7 = (trg->super_SQObject)._unVal.pTable;
        (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  (pSVar7,uVar13,puVar11);
      }
    }
    (trg->super_SQObject)._type = OT_INTEGER;
    (trg->super_SQObject)._unVal.pTable = pSVar9;
    return true;
  }
  if (op == 0x2b) {
    if ((SVar10 & 0x10) != 0) {
      bVar8 = StringCat(this,o1,o2,trg);
      goto LAB_001298e7;
    }
    op = 0x2b;
  }
  bVar8 = ArithMetaMethod(this,op,o1,o2,trg);
LAB_001298e7:
  if (bVar8 != false) {
    return true;
  }
  return false;
}

Assistant:

bool SQVM::ARITH_OP(SQUnsignedInteger op,SQObjectPtr &trg,const SQObjectPtr &o1,const SQObjectPtr &o2)
{
    SQInteger tmask = type(o1)|type(o2);
    switch(tmask) {
        case OT_INTEGER:{
            SQInteger res, i1 = _integer(o1), i2 = _integer(o2);
            switch(op) {
            case '+': res = i1 + i2; break;
            case '-': res = i1 - i2; break;
            case '/': if (i2 == 0) { Raise_Error(_SC("division by zero")); return false; }
                    else if (i2 == -1 && i1 == INT_MIN) { Raise_Error(_SC("integer overflow")); return false; }
                    res = i1 / i2;
                    break;
            case '*': res = i1 * i2; break;
            case '%': if (i2 == 0) { Raise_Error(_SC("modulo by zero")); return false; }
                    else if (i2 == -1 && i1 == INT_MIN) { res = 0; break; }
                    res = i1 % i2;
                    break;
            default: res = 0xDEADBEEF;
            }
            trg = res; }
            break;
        case (OT_FLOAT|OT_INTEGER):
        case (OT_FLOAT):{
            SQFloat res, f1 = tofloat(o1), f2 = tofloat(o2);
            switch(op) {
            case '+': res = f1 + f2; break;
            case '-': res = f1 - f2; break;
            case '/': res = f1 / f2; break;
            case '*': res = f1 * f2; break;
            case '%': res = SQFloat(fmod((double)f1,(double)f2)); break;
            default: res = 0x0f;
            }
            trg = res; }
            break;
        default:
            if(op == '+' && (tmask & _RT_STRING)){
                if(!StringCat(o1, o2, trg)) return false;
            }
            else if(!ArithMetaMethod(op,o1,o2,trg)) {
                return false;
            }
    }
    return true;
}